

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::QualifierOverrideLayoutTest::prepareShaderSource
          (QualifierOverrideLayoutTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  pointer psVar1;
  TestError *this_00;
  char *pcVar2;
  char *pcVar3;
  size_t position;
  size_t local_38;
  
  switch(in_stage) {
  case COMPUTE_SHADER:
    goto switchD_009e7c30_caseD_0;
  case VERTEX_SHADER:
    pcVar3 = 
    "VERSION\n\nin  layout(location = 3) layout(location = 2) vec4 in_vs_test;\nout layout(location = 3) layout(location = 2) vec4 vs_tcs_result;\n\nvoid main()\n{\n    vec4 result = in_vs_test;\n\n    vs_tcs_result = result;\n}\n\n"
    ;
    break;
  case TESS_CTRL_SHADER:
    pcVar3 = 
    "VERSION\n\nlayout(vertices = 4) layout(vertices = 1) out;\n\nin  layout(location = 3) layout(location = 2) vec4 vs_tcs_result[];\nout layout(location = 3) layout(location = 2) vec4 tcs_tes_result[];\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\n    if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    tcs_tes_result[gl_InvocationID] = result;\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n}\n\n"
    ;
    break;
  case TESS_EVAL_SHADER:
    pcVar3 = 
    "VERSION\n\nlayout(isolines, point_mode) in;\n\nin  layout(location = 3) layout(location = 2) vec4 tcs_tes_result[];\nout layout(location = 3) layout(location = 2) vec4 tes_gs_result;\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\n    if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    tes_gs_result = result;\n}\n\n"
    ;
    break;
  case GEOMETRY_SHADER:
    pcVar3 = 
    "VERSION\n\nlayout(points)                                                    in;\nlayout(triangle_strip, max_vertices = 2) layout(max_vertices = 4) out;\n\nin  layout(location = 3) layout(location = 2) vec4 tes_gs_result[];\nout layout(location = 3) layout(location = 2) vec4 gs_fs_result;\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\n    if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    gs_fs_result = result;\n    gl_Position  = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    gs_fs_result = result;\n    gl_Position  = vec4(-1, 1, 0, 1);\n    EmitVertex();\n    gs_fs_result = result;\n    gl_Position  = vec4(1, -1, 0, 1);\n    EmitVertex();\n    gs_fs_result = result;\n    gl_Position  = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
    ;
    break;
  case FRAGMENT_SHADER:
    pcVar3 = 
    "VERSION\n\nin  layout(location = 3) layout(location = 2) vec4 gs_fs_result;\nout vec4 fs_out_result;\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\n    if (vec4(0, 1, 0, 1) != gs_fs_result)\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    fs_out_result = result;\n}\n\n"
    ;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x1ed1);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  psVar1 = (out_source->m_parts).
           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (char *)(psVar1->m_code)._M_string_length;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)pcVar3);
  local_38 = 0;
  pcVar3 = "#version 420";
  if (in_use_version_400) {
    pcVar3 = 
    "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
    ;
  }
  pcVar2 = "#version 430";
  if (in_stage != COMPUTE_SHADER) {
    pcVar2 = pcVar3;
  }
  Utils::replaceToken("VERSION",&local_38,pcVar2,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
switchD_009e7c30_caseD_0:
  return;
}

Assistant:

void QualifierOverrideLayoutTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
													  Utils::shaderSource& out_source)
{
	static const GLchar* fragment_shader_template = "VERSION\n"
													"\n"
													"in  layout(location = 3) layout(location = 2) vec4 gs_fs_result;\n"
													"out vec4 fs_out_result;\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"    if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template =
		"VERSION\n"
		"\n"
		"layout(points)                                                    in;\n"
		"layout(triangle_strip, max_vertices = 2) layout(max_vertices = 4) out;\n"
		"\n"
		"in  layout(location = 3) layout(location = 2) vec4 tes_gs_result[];\n"
		"out layout(location = 3) layout(location = 2) vec4 gs_fs_result;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"    if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    gs_fs_result = result;\n"
		"    gl_Position  = vec4(-1, -1, 0, 1);\n"
		"    EmitVertex();\n"
		"    gs_fs_result = result;\n"
		"    gl_Position  = vec4(-1, 1, 0, 1);\n"
		"    EmitVertex();\n"
		"    gs_fs_result = result;\n"
		"    gl_Position  = vec4(1, -1, 0, 1);\n"
		"    EmitVertex();\n"
		"    gs_fs_result = result;\n"
		"    gl_Position  = vec4(1, 1, 0, 1);\n"
		"    EmitVertex();\n"
		"}\n"
		"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"layout(vertices = 4) layout(vertices = 1) out;\n"
		"\n"
		"in  layout(location = 3) layout(location = 2) vec4 vs_tcs_result[];\n"
		"out layout(location = 3) layout(location = 2) vec4 tcs_tes_result[];\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"    if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template =
		"VERSION\n"
		"\n"
		"layout(isolines, point_mode) in;\n"
		"\n"
		"in  layout(location = 3) layout(location = 2) vec4 tcs_tes_result[];\n"
		"out layout(location = 3) layout(location = 2) vec4 tes_gs_result;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"    if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tes_gs_result = result;\n"
		"}\n"
		"\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "in  layout(location = 3) layout(location = 2) vec4 in_vs_test;\n"
												  "out layout(location = 3) layout(location = 2) vec4 vs_tcs_result;\n"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = in_vs_test;\n"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "}\n"
												  "\n";

	const GLchar* shader_template = 0;

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		return;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;

	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);
}